

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::RenameFieldInfo::Deserialize(RenameFieldInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  tuple<duckdb::RenameFieldInfo_*,_std::default_delete<duckdb::RenameFieldInfo>_> this_00;
  pointer pRVar2;
  pointer *__ptr;
  unique_ptr<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>,_true> result;
  __uniq_ptr_impl<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>_> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::RenameFieldInfo_*,_std::default_delete<duckdb::RenameFieldInfo>_>.
  super__Head_base<0UL,_duckdb::RenameFieldInfo_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::RenameFieldInfo_*,_std::default_delete<duckdb::RenameFieldInfo>_>)
       operator_new(0xb0);
  RenameFieldInfo((RenameFieldInfo *)
                  this_00.
                  super__Tuple_impl<0UL,_duckdb::RenameFieldInfo_*,_std::default_delete<duckdb::RenameFieldInfo>_>
                  .super__Head_base<0UL,_duckdb::RenameFieldInfo_*,_false>._M_head_impl);
  local_58._M_t.
  super__Tuple_impl<0UL,_duckdb::RenameFieldInfo_*,_std::default_delete<duckdb::RenameFieldInfo>_>.
  super__Head_base<0UL,_duckdb::RenameFieldInfo_*,_false>._M_head_impl =
       (tuple<duckdb::RenameFieldInfo_*,_std::default_delete<duckdb::RenameFieldInfo>_>)
       (tuple<duckdb::RenameFieldInfo_*,_std::default_delete<duckdb::RenameFieldInfo>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::RenameFieldInfo_*,_std::default_delete<duckdb::RenameFieldInfo>_>
       .super__Head_base<0UL,_duckdb::RenameFieldInfo_*,_false>._M_head_impl;
  pRVar2 = unique_ptr<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,400,"column_path",&pRVar2->column_path);
  pRVar2 = unique_ptr<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RenameFieldInfo,_std::default_delete<duckdb::RenameFieldInfo>,_true>
                       *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x191,"new_name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pRVar2->new_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005d3c37;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pRVar2->new_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005d3c37;
  }
  operator_delete(local_50);
LAB_005d3c37:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_58._M_t.
       super__Tuple_impl<0UL,_duckdb::RenameFieldInfo_*,_std::default_delete<duckdb::RenameFieldInfo>_>
       .super__Head_base<0UL,_duckdb::RenameFieldInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> RenameFieldInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RenameFieldInfo>(new RenameFieldInfo());
	deserializer.ReadPropertyWithDefault<vector<string>>(400, "column_path", result->column_path);
	deserializer.ReadPropertyWithDefault<string>(401, "new_name", result->new_name);
	return std::move(result);
}